

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O1

shared_ptr<helics::helicsCLI11App> __thiscall helics::BrokerBase::generateBaseCLI(BrokerBase *this)

{
  MultiOptionPolicy MVar1;
  long lVar2;
  HelicsConfigJSON *pHVar3;
  Option *pOVar4;
  Option *this_00;
  App *pAVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  long in_RSI;
  shared_ptr<helics::helicsCLI11App> sVar7;
  initializer_list<const_char_*> values;
  _Any_data local_aa8;
  code *local_a98;
  code *pcStack_a90;
  _Any_data local_a88;
  code *local_a78;
  undefined8 uStack_a70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a68;
  undefined8 local_a60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a58;
  undefined4 local_a48;
  undefined2 local_a44;
  _Any_data local_a38;
  code *local_a28;
  code *pcStack_a20;
  string local_a10;
  string local_9f0;
  atomic<helics::GlobalBrokerId> *local_9d0;
  long *local_9c8;
  long local_9c0;
  long local_9b8 [2];
  string local_9a8;
  string local_988;
  string local_968;
  string local_948;
  string local_928;
  string local_908;
  string local_8e8;
  string local_8c8;
  string local_8a8;
  string local_888;
  string local_868;
  string local_848;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  _Any_data local_168;
  code *local_158;
  undefined8 local_150;
  _Any_data local_148;
  code *local_138;
  undefined8 local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  undefined8 local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined4 local_108;
  undefined2 local_104;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  char *local_58;
  char *pcStack_50;
  char *local_48;
  char *pcStack_40;
  
  this->_vptr_BrokerBase = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<helics::helicsCLI11App,std::allocator<helics::helicsCLI11App>,char_const(&)[44]>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->global_id,(helicsCLI11App **)this,
             (allocator<helics::helicsCLI11App> *)&local_aa8,
             (char (*) [44])"Arguments applying to all Brokers and Cores");
  local_9d0 = &this->global_id;
  pHVar3 = addJsonConfig((App *)this->_vptr_BrokerBase);
  (pHVar3->super_ConfigBase).maximumLayers = '\0';
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"helics","");
  generateBaseCLI();
  pAVar5 = (App *)this->_vptr_BrokerBase;
  (pAVar5->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_case_ = true;
  (pAVar5->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_underscore_ = true;
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"--federates,-f","");
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,"the minimum number of federates that will be connecting","");
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (pAVar5,&local_188,(int *)(in_RSI + 0x18),&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"--maxfederates","");
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e8,"the maximum number of federates that will be connecting","");
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (pAVar5,&local_1c8,(int *)(in_RSI + 0x20),&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,"--name,-n,--identifier,--uuid","");
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_228,"the name of the broker/core","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar5,&local_208,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x68),
             &local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"--max_iterations","");
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"the maximum number of iterations allowed","");
  pOVar4 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar5,&local_248,(int *)(in_RSI + 0x2c),&local_268);
  CLI::Option::capture_default_str(pOVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,"--minbrokers,--minbroker,--minbrokercount","");
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8,
             "the minimum number of cores/brokers that need to be connected (ignored in cores)","");
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (pAVar5,&local_288,(int *)(in_RSI + 0x1c),&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"--children,--subbrokers","")
  ;
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,
             "the minimum number of child objects that need to be connected before entering init mode"
             ,"");
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (pAVar5,&local_2c8,(int *)(in_RSI + 0x28),&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"--maxbrokers","");
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_328,
             "the maximum number of brokers that will be connecting (ignored in cores)","");
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (pAVar5,&local_308,(int *)(in_RSI + 0x24),&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"--brokerkey","");
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_368,"specify a key to use for all connections to/from a broker","");
  pOVar4 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar5,&local_348,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (in_RSI + 0x88),&local_368);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"HELICS_BROKER_KEY","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar4->envname_,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"--slowresponding","");
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,
             "specify that a broker might be slow or unresponsive to ping requests from other brokers"
             ,"");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar5,&local_388,(bool *)(in_RSI + 0x20d),&local_3a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3c8,"--restrictive_time_policy","");
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3e8,
             "specify that a broker should use a conservative time policy in the time coordinator",
             "");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar5,&local_3c8,(bool *)(in_RSI + 0xd1),&local_3e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"--debugging","");
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_428,
             "specify that a broker/core should operate in user debugging mode equivalent to --slow_responding --disable_timer"
             ,"");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar5,&local_408,(bool *)(in_RSI + 0xd3),&local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_448,"--allow_remote_control,!--disable_remote_control","");
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_468,
             "enable the broker to respond to certain remote commands that affect operations, such as disconnect"
             ,"");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar5,&local_448,(bool *)(in_RSI + 0x211),&local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"--globaltime","");
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4a8,
             "specify that the broker should use a globalTime coordinator to coordinate a master clock time with all federates"
             ,"");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar5,&local_488,(bool *)(in_RSI + 0xd5),&local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"--global_disconnect","");
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4e8,
             "specify that all federates should delay disconnection until all are done","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar5,&local_4c8,(bool *)(in_RSI + 0x213),&local_4e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"--asynctime","");
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_528,
             "specify that the federation should use the asynchronous time coordinator (only minimal time management is handled in HELICS and federates are allowed to operate independently)"
             ,"");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar5,&local_508,(bool *)(in_RSI + 0xd6),&local_528);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_9f0._M_dataplus._M_p = (pointer)&local_9f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9f0,"--timing","");
  local_a38._8_8_ = 0;
  pcStack_a20 = CLI::std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:174:13)>
                ::_M_invoke;
  local_a28 = CLI::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:174:13)>
              ::_M_manager;
  local_a10._M_dataplus._M_p = (pointer)&local_a10.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a10,"specify the timing method to use in the broker","");
  pOVar4 = CLI::App::add_option_function<std::__cxx11::string>
                     (pAVar5,&local_9f0,
                      (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&local_a38,&local_a10);
  local_48 = "distributed";
  pcStack_40 = "default";
  local_58 = "async";
  pcStack_50 = "global";
  values._M_len = 4;
  values._M_array = &local_58;
  CLI::IsMember::IsMember<char_const*>((IsMember *)&local_aa8,values);
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  local_158 = (code *)0x0;
  local_150 = pcStack_a90;
  if (local_a98 != (code *)0x0) {
    local_168._M_unused._M_object = local_aa8._M_unused._M_object;
    local_168._8_8_ = local_aa8._8_8_;
    local_158 = local_a98;
    local_a98 = (code *)0x0;
    pcStack_a90 = (code *)0x0;
  }
  local_148._M_unused._M_object = (void *)0x0;
  local_148._8_8_ = 0;
  local_138 = (code *)0x0;
  local_130 = uStack_a70;
  if (local_a78 != (code *)0x0) {
    local_148._M_unused._M_object = local_a88._M_unused._M_object;
    local_148._8_8_ = local_a88._8_8_;
    local_138 = local_a78;
    local_a78 = (code *)0x0;
    uStack_a70 = 0;
  }
  if (local_a68 == &local_a58) {
    local_118._8_4_ = local_a58._8_4_;
    local_118._12_4_ = local_a58._12_4_;
    local_128 = &local_118;
  }
  else {
    local_128 = local_a68;
  }
  local_118._M_allocated_capacity._4_4_ = local_a58._M_allocated_capacity._4_4_;
  local_118._M_allocated_capacity._0_4_ = local_a58._M_allocated_capacity._0_4_;
  local_120 = local_a60;
  local_a60 = 0;
  local_a58._M_allocated_capacity._0_4_ = local_a58._M_allocated_capacity._0_4_ & 0xffffff00;
  local_108 = local_a48;
  local_104 = local_a44;
  local_a68 = &local_a58;
  local_9c8 = local_9b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9c8,"");
  local_104 = CONCAT11(1,(undefined1)local_104);
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::emplace_back<CLI::Validator>
            (&pOVar4->validators_,(Validator *)&local_168);
  if (local_9c0 != 0) {
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,local_9c8,local_9c0 + (long)local_9c8);
    generateBaseCLI();
  }
  if (local_9c8 != local_9b8) {
    operator_delete(local_9c8,local_9b8[0] + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118._M_allocated_capacity + 1);
  }
  if (local_138 != (code *)0x0) {
    (*local_138)(&local_148,&local_148,__destroy_functor);
  }
  if (local_158 != (code *)0x0) {
    (*local_158)(&local_168,&local_168,__destroy_functor);
  }
  if (local_a68 != &local_a58) {
    operator_delete(local_a68,
                    CONCAT44(local_a58._M_allocated_capacity._4_4_,
                             local_a58._M_allocated_capacity._0_4_) + 1);
  }
  if (local_a78 != (code *)0x0) {
    (*local_a78)(&local_a88,&local_a88,__destroy_functor);
  }
  if (local_a98 != (code *)0x0) {
    (*local_a98)(&local_aa8,&local_aa8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10._M_dataplus._M_p != &local_a10.field_2) {
    operator_delete(local_a10._M_dataplus._M_p,local_a10.field_2._M_allocated_capacity + 1);
  }
  if (local_a28 != (code *)0x0) {
    (*local_a28)(&local_a38,&local_a38,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"--observer","");
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_568,"specify that the broker/core should be added as an observer only"
             ,"");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar5,&local_548,(bool *)(in_RSI + 0xd4),&local_568);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"--dynamic","");
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5a8,"specify that the broker/core should allow dynamic federates","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar5,&local_588,(bool *)(in_RSI + 0xd7),&local_5a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5c8,"--disable_dynamic_sources","");
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5e8,
             "specify that the data sources must be registered before entering Initializing mode",""
            );
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar5,&local_5c8,(bool *)(in_RSI + 0xd8),&local_5e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"--json","");
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_628,"use the JSON serialization mode for communications","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar5,&local_608,(bool *)(in_RSI + 0x20f),&local_628);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"--profiler","");
  local_aa8._8_8_ = 0;
  pcStack_a90 = CLI::std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:204:17)>
                ::_M_invoke;
  local_a98 = CLI::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:204:17)>
              ::_M_manager;
  local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_668,
             "activate profiling and set the profiler data output file, set to empty string to disable profiling, set to \"log\" to route profile message to the logging system."
             ,"");
  pOVar4 = CLI::App::add_option_function<std::__cxx11::string>
                     (pAVar5,&local_648,
                      (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&local_aa8,&local_668);
  pOVar4->expected_min_ = 0;
  pOVar4->expected_max_ = 1;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"log","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar4->default_str_,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2) {
    operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
  }
  if (local_a98 != (code *)0x0) {
    (*local_a98)(&local_aa8,&local_aa8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2) {
    operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_688,"--profiler_append","");
  local_aa8._8_8_ = 0;
  pcStack_a90 = CLI::std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:229:13)>
                ::_M_invoke;
  local_a98 = CLI::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:229:13)>
              ::_M_manager;
  local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6a8,
             "activate profiling and set the profiler data output file; new profiler output will be appended to the file"
             ,"");
  this_00 = CLI::App::add_option_function<std::__cxx11::string>
                      (pAVar5,&local_688,
                       (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_aa8,&local_6a8);
  CLI::Option::excludes(this_00,pOVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
  }
  if (local_a98 != (code *)0x0) {
    (*local_a98)(&local_aa8,&local_aa8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"--terminate_on_error","");
  local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6e8,
             "specify that a broker should cause the federation to terminate on an error","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar5,&local_6c8,(bool *)(in_RSI + 0xd2),&local_6e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"--error_on_unmatched","");
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_728,
             "set the broker to terminate the cosimulation if there are unmatched connections","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar5,&local_708,(bool *)(in_RSI + 0x212),&local_728);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p,local_728.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._M_dataplus._M_p != &local_708.field_2) {
    operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
  }
  LogManager::addLoggingCLI
            (*(LogManager **)(in_RSI + 0x1f8),(shared_ptr<helics::helicsCLI11App> *)this);
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"--dumplog","");
  local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_768,
             "capture a record of all messages and dump a complete log to file or console on termination"
             ,"");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar5,&local_748,(bool *)(in_RSI + 0xda),&local_768);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
  }
  pAVar5 = (App *)this->_vptr_BrokerBase;
  local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,"timeouts","");
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7a8,"Options related to network and process timeouts","");
  pAVar5 = &CLI::App::add_option_group<CLI::Option_group>(pAVar5,&local_788,&local_7a8)->super_App;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
  }
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,"--tick","");
  local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7e8,
             "heartbeat time in ms, if there is no broker communication for 2 ticks then secondary actions are taken (can also be entered as a time like \'10s\' or \'45ms\')"
             ,"");
  pOVar4 = CLI::App::
           add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
                     (pAVar5,&local_7c8,(TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0x30),
                      &local_7e8);
  CLI::Option::capture_default_str(pOVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
    operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
  }
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_808,"--disable_timer,--no_tick","");
  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_828,
             "if set to true all timeouts are disabled, cannot be re-enabled later","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar5,&local_808,(bool *)(in_RSI + 0xdc),&local_828);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
  }
  local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_848,"--timeout","");
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_868,
             "time to wait to establish a network or for a connection to communicate, default unit is in ms (can also be entered as a time like \'10s\' or \'45ms\') "
             ,"");
  pOVar4 = CLI::App::
           add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
                     (pAVar5,&local_848,(TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0x38),
                      &local_868);
  CLI::Option::capture_default_str(pOVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != &local_848.field_2) {
    operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
  }
  local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_888,"--networktimeout","");
  local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8a8,
             "time to wait for a broker connection, default unit is in ms (can also be entered as a time like \'10s\' or \'45ms\') "
             ,"");
  pOVar4 = CLI::App::
           add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
                     (pAVar5,&local_888,(TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0x40),
                      &local_8a8);
  CLI::Option::capture_default_str(pOVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
    operator_delete(local_8a8._M_dataplus._M_p,local_8a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888._M_dataplus._M_p != &local_888.field_2) {
    operator_delete(local_888._M_dataplus._M_p,local_888.field_2._M_allocated_capacity + 1);
  }
  local_8c8._M_dataplus._M_p = (pointer)&local_8c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,"--querytimeout","");
  local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8e8,
             "time to wait for a query to be answered; default unit is in ms  and default time is 15s (can also be entered as a time like \'10s\' or \'45ms\') "
             ,"");
  CLI::App::
  add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
            (pAVar5,&local_8c8,(TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0x48),
             &local_8e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
    operator_delete(local_8e8._M_dataplus._M_p,local_8e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
    operator_delete(local_8c8._M_dataplus._M_p,local_8c8.field_2._M_allocated_capacity + 1);
  }
  local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"--granttimeout","");
  local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_928,
             "time to wait for a time request to be granted before triggering diagnostic actions; default is in ms (can also be entered as a time like \'10s\' or \'45ms\')"
             ,"");
  CLI::App::
  add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
            (pAVar5,&local_908,(TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0x58),
             &local_928);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != &local_928.field_2) {
    operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908._M_dataplus._M_p != &local_908.field_2) {
    operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
  }
  local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_948,"--maxcosimduration","");
  local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_968,
             "the maximum time a broker/core should be active, the co-simulation will self terminate if it is still active after this duration, the time resolution is the tick timer (can also be entered as a time like \'10s\' or \'45ms\')"
             ,"");
  pOVar4 = CLI::App::
           add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
                     (pAVar5,&local_948,(TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0x60),
                      &local_968);
  MVar1 = (pOVar4->super_OptionBase<CLI::Option>).multi_option_policy_;
  if (MVar1 != TakeLast) {
    if (((MVar1 == Throw) && (pOVar4->expected_max_ == 0x20000000)) && (1 < pOVar4->expected_min_))
    {
      pOVar4->expected_max_ = pOVar4->expected_min_;
    }
    (pOVar4->super_OptionBase<CLI::Option>).multi_option_policy_ = TakeLast;
    pOVar4->current_option_state_ = parsing;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968._M_dataplus._M_p != &local_968.field_2) {
    operator_delete(local_968._M_dataplus._M_p,local_968.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948._M_dataplus._M_p != &local_948.field_2) {
    operator_delete(local_948._M_dataplus._M_p,local_948.field_2._M_allocated_capacity + 1);
  }
  local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_988,"--errordelay,--errortimeout","");
  local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9a8,
             "time to wait after an error state before terminating like \'10s\' or \'45ms\') ","");
  pOVar4 = CLI::App::
           add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
                     (pAVar5,&local_988,(TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0x50),
                      &local_9a8);
  lVar2 = ((TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0x50))->internalTimeCode;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_f8,vsnprintf,0x148,"%f",
             SUB84((double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000),0));
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar4->default_str_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
  _Var6._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    _Var6._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
    operator_delete(local_9a8._M_dataplus._M_p,local_9a8.field_2._M_allocated_capacity + 1);
    _Var6._M_pi = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988._M_dataplus._M_p != &local_988.field_2) {
    operator_delete(local_988._M_dataplus._M_p,local_988.field_2._M_allocated_capacity + 1);
    _Var6._M_pi = extraout_RDX_02;
  }
  sVar7.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar7.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar7.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> BrokerBase::generateBaseCLI()
{
    auto hApp = std::make_shared<helicsCLI11App>("Arguments applying to all Brokers and Cores");
    auto* fmtr = addJsonConfig(hApp.get());
    fmtr->maxLayers(0);
    fmtr->promoteSection("helics");
    hApp->option_defaults()->ignore_underscore()->ignore_case();
    hApp->add_option("--federates,-f",
                     minFederateCount,
                     "the minimum number of federates that will be connecting");
    hApp->add_option("--maxfederates",
                     maxFederateCount,
                     "the maximum number of federates that will be connecting");
    hApp->add_option("--name,-n,--identifier,--uuid", identifier, "the name of the broker/core");
    hApp->add_option("--max_iterations",
                     maxIterationCount,
                     "the maximum number of iterations allowed")
        ->capture_default_str();
    hApp->add_option(
        "--minbrokers,--minbroker,--minbrokercount",
        minBrokerCount,
        "the minimum number of cores/brokers that need to be connected (ignored in cores)");
    hApp->add_option(
        "--children,--subbrokers",
        minChildCount,
        "the minimum number of child objects that need to be connected before entering init mode");
    hApp->add_option("--maxbrokers",
                     maxBrokerCount,
                     "the maximum number of brokers that will be connecting (ignored in cores)");
    hApp->add_option("--brokerkey",
                     brokerKey,
                     "specify a key to use for all connections to/from a broker")
        ->envname("HELICS_BROKER_KEY");
    hApp->add_flag(
        "--slowresponding",
        no_ping,
        "specify that a broker might be slow or unresponsive to ping requests from other brokers");
    hApp->add_flag(
        "--restrictive_time_policy",
        restrictive_time_policy,
        "specify that a broker should use a conservative time policy in the time coordinator");
    hApp->add_flag(
        "--debugging",
        debugging,
        "specify that a broker/core should operate in user debugging mode equivalent to --slow_responding --disable_timer");
    hApp->add_flag(
        "--allow_remote_control,!--disable_remote_control",
        allowRemoteControl,
        "enable the broker to respond to certain remote commands that affect operations, such as disconnect");
    hApp->add_flag(
        "--globaltime",
        globalTime,
        "specify that the broker should use a globalTime coordinator to coordinate a master clock time with all federates");
    hApp->add_flag("--global_disconnect",
                   globalDisconnect,
                   "specify that all federates should delay disconnection until all are done");
    hApp->add_flag(
        "--asynctime",
        asyncTime,
        "specify that the federation should use the asynchronous time coordinator (only minimal time management is handled in HELICS and federates are allowed to operate independently)");
    hApp->add_option_function<std::string>(
            "--timing",
            [this](const std::string& arg) {
                if (arg == "async") {
                    asyncTime = true;
                } else if (arg == "global") {
                    globalTime = true;
                } else {
                    asyncTime = false;
                    globalTime = false;
                }
            },
            "specify the timing method to use in the broker")
        ->check(CLI::IsMember({"async", "global", "distributed", "default"}));
    hApp->add_flag("--observer",
                   observer,
                   "specify that the broker/core should be added as an observer only");
    hApp->add_flag("--dynamic",
                   dynamicFederation,
                   "specify that the broker/core should allow dynamic federates");
    hApp->add_flag(
        "--disable_dynamic_sources",
        disableDynamicSources,
        "specify that the data sources must be registered before entering Initializing mode");
    hApp->add_flag("--json",
                   useJsonSerialization,
                   "use the JSON serialization mode for communications");

    // add the profiling setup command
    auto* popt =
        hApp->add_option_function<std::string>(
                "--profiler",
                [this](const std::string& fileName) {
                    if (!fileName.empty()) {
                        if (fileName == "log" || fileName == "true") {
                            if (prBuff) {
                                prBuff.reset();
                            }
                        } else {
                            if (!prBuff) {
                                prBuff = std::make_shared<ProfilerBuffer>();
                            }
                            prBuff->setOutputFile(fileName, false);
                        }

                        enable_profiling = true;
                    } else {
                        enable_profiling = false;
                    }
                },
                "activate profiling and set the profiler data output file, set to empty string to disable profiling, set to \"log\" to route profile message to the logging system.")
            ->expected(0, 1)
            ->default_str("log");

    // add the profiling append file option
    hApp->add_option_function<std::string>(
            "--profiler_append",
            [this](const std::string& fileName) {
                if (!fileName.empty()) {
                    if (!prBuff) {
                        prBuff = std::make_shared<ProfilerBuffer>();
                    }
                    prBuff->setOutputFile(fileName, true);

                    enable_profiling = true;
                } else {
                    enable_profiling = false;
                }
            },
            "activate profiling and set the profiler data output file; new profiler output will be appended to the file")
        ->excludes(popt);

    hApp->add_flag("--terminate_on_error",
                   terminate_on_error,
                   "specify that a broker should cause the federation to terminate on an error");
    hApp->add_flag(
        "--error_on_unmatched",
        errorOnUnmatchedConnections,
        "set the broker to terminate the cosimulation if there are unmatched connections");
    mLogManager->addLoggingCLI(hApp);

    hApp->add_flag(
        "--dumplog",
        dumplog,
        "capture a record of all messages and dump a complete log to file or console on termination");

    auto* timeout_group =
        hApp->add_option_group("timeouts", "Options related to network and process timeouts");
    timeout_group
        ->add_option(
            "--tick",
            tickTimer,
            "heartbeat time in ms, if there is no broker communication for 2 ticks then "
            "secondary actions are taken (can also be entered as a time like '10s' or '45ms')")
        ->capture_default_str();
    timeout_group->add_flag("--disable_timer,--no_tick",
                            disable_timer,
                            "if set to true all timeouts are disabled, cannot be re-enabled later");
    timeout_group
        ->add_option(
            "--timeout",
            timeout,
            "time to wait to establish a network or for a connection to communicate, default "
            "unit is in ms (can also be entered as "
            "a time like '10s' or '45ms') ")
        ->capture_default_str();
    timeout_group
        ->add_option(
            "--networktimeout",
            networkTimeout,
            "time to wait for a broker connection, default unit is in ms (can also be entered as a time "
            "like '10s' or '45ms') ")
        ->capture_default_str();
    timeout_group->add_option(
        "--querytimeout",
        queryTimeout,
        "time to wait for a query to be answered; default unit is in ms  and default time is 15s (can also be entered as a time "
        "like '10s' or '45ms') ");
    timeout_group->add_option(
        "--granttimeout",
        grantTimeout,
        "time to wait for a time request to be granted before triggering diagnostic actions; default is in ms (can also be entered as a time "
        "like '10s' or '45ms')");
    timeout_group
        ->add_option(
            "--maxcosimduration",
            maxCoSimDuration,
            "the maximum time a broker/core should be active, the co-simulation will self terminate if it is still active after this duration, the time resolution is the tick timer (can also be entered as a time "
            "like '10s' or '45ms')")
        ->multi_option_policy(CLI::MultiOptionPolicy::TakeLast);
    timeout_group
        ->add_option("--errordelay,--errortimeout",
                     errorDelay,
                     "time to wait after an error state before terminating "
                     "like '10s' or '45ms') ")
        ->default_str(std::to_string(static_cast<double>(errorDelay)));

    return hApp;
}